

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  
  fVar6 = (&(window->ScrollbarSizes).x)[axis ^ ImGuiAxis_Y];
  if (axis == ImGuiAxis_X) {
    fVar4 = (window->InnerRect).Max.x;
    fVar2 = (window->Pos).y;
    fVar1 = (window->InnerRect).Min.x;
    fVar5 = (window->Size).y + fVar2;
    fVar6 = (fVar5 - window->WindowBorderSize) - fVar6;
    uVar3 = -(uint)(fVar6 <= fVar2);
    fVar2 = (float)(uVar3 & (uint)fVar2 | ~uVar3 & (uint)fVar6);
  }
  else {
    fVar5 = (window->InnerRect).Max.y;
    fVar1 = (window->Pos).x;
    fVar2 = (window->InnerRect).Min.y;
    fVar4 = (window->Size).x + fVar1;
    fVar6 = (fVar4 - window->WindowBorderSize) - fVar6;
    uVar3 = -(uint)(fVar6 <= fVar1);
    fVar1 = (float)(uVar3 & (uint)fVar1 | ~uVar3 & (uint)fVar6);
  }
  IVar7.Max.y = fVar5;
  IVar7.Max.x = fVar4;
  IVar7.Min.y = fVar2;
  IVar7.Min.x = fVar1;
  return IVar7;
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x, outer_rect.Max.y);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x, inner_rect.Max.y);
}